

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O3

void __thiscall haVoc::Moveorder::~Moveorder(Moveorder *this)

{
  pointer pMVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->_vptr_Moveorder = (_func_int **)&PTR_next_phase_001409a0;
  pMVar1 = (this->_killerMoves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar1 != (pointer)0x0) {
    operator_delete(pMVar1,(long)(this->_killerMoves).
                                 super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pMVar1);
  }
  p_Var2 = (this->m_movegen).super___shared_ptr<Movegen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->m_quiets).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->m_captures).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

virtual ~Moveorder() { }